

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O1

void __thiscall vectorgraphics::TikzPlotter::makePDF(TikzPlotter *this,path *path,string *name)

{
  pointer pcVar1;
  bool bVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  string *this_00;
  string tex_name;
  path full_tex_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  long *local_180 [2];
  long local_170 [2];
  string local_160;
  long *local_140 [2];
  long local_130 [2];
  path local_120;
  undefined1 local_f8 [80];
  path local_a8;
  undefined1 local_80 [80];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_1a0);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)(local_80 + 0x28),&local_1a0,auto_format);
  std::filesystem::__cxx11::operator/(&local_120,path,(path *)(local_80 + 0x28));
  std::filesystem::__cxx11::path::~path((path *)(local_80 + 0x28));
  std::filesystem::create_directories(path);
  std::filesystem::__cxx11::path::path((path *)local_80,path);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_140,pcVar1,pcVar1 + name->_M_string_length);
  cleanup((TikzPlotter *)local_80,(EVP_PKEY_CTX *)local_140);
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)local_80);
  std::filesystem::__cxx11::path::path(&local_a8,&local_120);
  bVar2 = createTexFile(this,&local_a8);
  std::filesystem::__cxx11::path::~path(&local_a8);
  if (bVar2) {
    std::filesystem::__cxx11::path::path((path *)(local_f8 + 0x28),path);
    pcVar1 = (name->_M_dataplus)._M_p;
    this_00 = &local_160;
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)this_00,pcVar1,pcVar1 + name->_M_string_length);
    bVar2 = compileTexFile((TikzPlotter *)this_00,(path *)(local_f8 + 0x28),&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path((path *)(local_f8 + 0x28));
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"makePDF: PDF succesfully created at ",0x24);
      pbVar3 = std::filesystem::__cxx11::operator<<
                         ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_120);
      std::ios::widen((char)*(undefined8 *)(*(long *)pbVar3 + -0x18) + (char)pbVar3);
      std::ostream::put((char)pbVar3);
      std::ostream::flush();
    }
  }
  std::filesystem::__cxx11::path::path((path *)local_f8,path);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_180[0] = local_170;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_180,pcVar1,pcVar1 + name->_M_string_length);
  cleanup((TikzPlotter *)local_f8,(EVP_PKEY_CTX *)local_180);
  if (local_180[0] != local_170) {
    operator_delete(local_180[0],local_170[0] + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)local_f8);
  std::filesystem::__cxx11::path::~path(&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TikzPlotter::makePDF(std::filesystem::path path, std::string name) {
    std::string tex_name = name + ".tex";
    std::filesystem::path full_tex_path = path / tex_name;

    // create directories
    std::filesystem::create_directories(path);

    // clean up before, in case there are some left over files
    cleanup(path, name);

    if (createTexFile(full_tex_path)) {
      if (compileTexFile(path, name)) {
        std::cout << "makePDF: PDF succesfully created at " << full_tex_path << std::endl;
      }
    }

    // clean up after
    cleanup(path, name);
  }